

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
::find_or_prepare_insert_soo<unsigned_long>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<unsigned_long,_unsigned_long>,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *this,unsigned_long *key)

{
  anon_union_8_1_a8a14541_for_iterator_2 aVar1;
  slot_type *psVar2;
  size_t sVar3;
  bool bVar4;
  ulong uVar5;
  iterator iVar6;
  
  AssertNotDebugCapacity(this);
  if ((this->settings_).
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ <
      2) {
    sVar3 = (this->settings_).
            super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
            capacity_;
    if (sVar3 != 1) {
      if (sVar3 == 0) {
        __assert_fail("cap >= kDefaultCapacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xb75,
                      "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, absl::hash_internal::Hash<unsigned long>, std::equal_to<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = absl::hash_internal::Hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
                     );
      }
      __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe3f,
                    "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, absl::hash_internal::Hash<unsigned long>, std::equal_to<unsigned long>, std::allocator<std::pair<const unsigned long, unsigned long>>>::try_sample_soo() [Policy = absl::container_internal::FlatHashMapPolicy<unsigned long, unsigned long>, Hash = absl::hash_internal::Hash<unsigned long>, Eq = std::equal_to<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, unsigned long>>]"
                   );
    }
    CommonFields::AssertInSooMode((CommonFields *)this);
    (this->settings_).
    super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 2
    ;
    aVar1.slot_ = soo_slot(this);
    bVar4 = true;
    iVar6.field_1.slot_ = aVar1.slot_;
    iVar6.ctrl_ = kSooControl;
  }
  else {
    psVar2 = soo_slot(this);
    if ((psVar2->value).first == *key) {
      aVar1.slot_ = soo_slot(this);
      iVar6.field_1.slot_ = aVar1.slot_;
      iVar6.ctrl_ = kSooControl;
      bVar4 = false;
    }
    else {
      resize_impl(this,3);
      uVar5 = (*key ^ (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
      sVar3 = PrepareInsertAfterSoo
                        (uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                         (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                         (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
                         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38,0x10,(CommonFields *)this);
      iVar6 = iterator_at(this,sVar3);
      bVar4 = true;
    }
  }
  __return_storage_ptr__->first = iVar6;
  __return_storage_ptr__->second = bVar4;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_soo(const K& key) {
    if (empty()) {
      const HashtablezInfoHandle infoz = try_sample_soo();
      if (infoz.IsSampled()) {
        resize_with_soo_infoz(infoz);
      } else {
        common().set_full_soo();
        return {soo_iterator(), true};
      }
    } else if (PolicyTraits::apply(EqualElement<K>{key, eq_ref()},
                                   PolicyTraits::element(soo_slot()))) {
      return {soo_iterator(), false};
    } else {
      resize(NextCapacity(SooCapacity()));
    }
    const size_t index =
        PrepareInsertAfterSoo(hash_ref()(key), sizeof(slot_type), common());
    return {iterator_at(index), true};
  }